

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_msg_header_chop_u64(nng_msg *msg,uint64_t *val)

{
  size_t sVar1;
  void *pvVar2;
  uint64_t v;
  uint8_t *header;
  uint64_t *val_local;
  nng_msg *msg_local;
  
  sVar1 = nng_msg_header_len(msg);
  if (sVar1 < 8) {
    msg_local._4_4_ = 3;
  }
  else {
    pvVar2 = nng_msg_header(msg);
    sVar1 = nng_msg_header_len(msg);
    *val = ((ulong)*(byte *)((long)pvVar2 + (sVar1 - 8)) << 0x38) +
           ((ulong)*(byte *)((long)pvVar2 + (sVar1 - 7)) << 0x30) +
           ((ulong)*(byte *)((long)pvVar2 + (sVar1 - 6)) << 0x28) +
           ((ulong)*(byte *)((long)pvVar2 + (sVar1 - 5)) << 0x20) +
           (ulong)*(byte *)((long)pvVar2 + (sVar1 - 4)) * 0x1000000 +
           (ulong)*(byte *)((long)pvVar2 + (sVar1 - 3)) * 0x10000 +
           (ulong)*(byte *)((long)pvVar2 + (sVar1 - 2)) * 0x100 +
           (ulong)*(byte *)((long)pvVar2 + (sVar1 - 1));
    nni_msg_header_chop(msg,8);
    msg_local._4_4_ = 0;
  }
  return msg_local._4_4_;
}

Assistant:

int
nng_msg_header_chop_u64(nng_msg *msg, uint64_t *val)
{
	uint8_t *header;
	uint64_t v;
	if (nng_msg_header_len(msg) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	header = nng_msg_header(msg);
	header += nng_msg_header_len(msg);
	header -= sizeof(v);
	NNI_GET64(header, v);
	*val = v;
	nni_msg_header_chop(msg, sizeof(*val));
	return (0);
}